

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,
               XrEventDataColocationAdvertisementCompleteMETA *value,string *prefix,
               string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  PFN_xrResultToString p_Var2;
  bool bVar3;
  XrInstance pXVar4;
  invalid_argument *this;
  char type_string_1 [64];
  string result_prefix;
  string type_prefix;
  string advertisementrequestid_prefix;
  string next_prefix;
  string local_50;
  
  PointerToHexString<XrEventDataColocationAdvertisementCompleteMETA>
            ((XrEventDataColocationAdvertisementCompleteMETA *)type_string_1._0_8_);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type_string_1);
  std::__cxx11::string::~string((string *)type_string_1);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)type_string_1,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type_string_1);
    std::__cxx11::string::~string((string *)type_string_1);
  }
  else {
    type_string_1[0x30] = '\0';
    type_string_1[0x31] = '\0';
    type_string_1[0x32] = '\0';
    type_string_1[0x33] = '\0';
    type_string_1[0x34] = '\0';
    type_string_1[0x35] = '\0';
    type_string_1[0x36] = '\0';
    type_string_1[0x37] = '\0';
    type_string_1[0x38] = '\0';
    type_string_1[0x39] = '\0';
    type_string_1[0x3a] = '\0';
    type_string_1[0x3b] = '\0';
    type_string_1[0x3c] = '\0';
    type_string_1[0x3d] = '\0';
    type_string_1[0x3e] = '\0';
    type_string_1[0x3f] = '\0';
    type_string_1[0x20] = '\0';
    type_string_1[0x21] = '\0';
    type_string_1[0x22] = '\0';
    type_string_1[0x23] = '\0';
    type_string_1[0x24] = '\0';
    type_string_1[0x25] = '\0';
    type_string_1[0x26] = '\0';
    type_string_1[0x27] = '\0';
    type_string_1[0x28] = '\0';
    type_string_1[0x29] = '\0';
    type_string_1[0x2a] = '\0';
    type_string_1[0x2b] = '\0';
    type_string_1[0x2c] = '\0';
    type_string_1[0x2d] = '\0';
    type_string_1[0x2e] = '\0';
    type_string_1[0x2f] = '\0';
    type_string_1[0x10] = '\0';
    type_string_1[0x11] = '\0';
    type_string_1[0x12] = '\0';
    type_string_1[0x13] = '\0';
    type_string_1[0x14] = '\0';
    type_string_1[0x15] = '\0';
    type_string_1[0x16] = '\0';
    type_string_1[0x17] = '\0';
    type_string_1[0x18] = '\0';
    type_string_1[0x19] = '\0';
    type_string_1[0x1a] = '\0';
    type_string_1[0x1b] = '\0';
    type_string_1[0x1c] = '\0';
    type_string_1[0x1d] = '\0';
    type_string_1[0x1e] = '\0';
    type_string_1[0x1f] = '\0';
    type_string_1[0] = '\0';
    type_string_1[1] = '\0';
    type_string_1[2] = '\0';
    type_string_1[3] = '\0';
    type_string_1[4] = '\0';
    type_string_1[5] = '\0';
    type_string_1[6] = '\0';
    type_string_1[7] = '\0';
    type_string_1[8] = '\0';
    type_string_1[9] = '\0';
    type_string_1[10] = '\0';
    type_string_1[0xb] = '\0';
    type_string_1[0xc] = '\0';
    type_string_1[0xd] = '\0';
    type_string_1[0xe] = '\0';
    type_string_1[0xf] = '\0';
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar4 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar4,value->type,type_string_1);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,&type_string_1);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_50,(string *)&next_prefix);
  bVar3 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_50,contents);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar3) {
    std::__cxx11::string::string((string *)&advertisementrequestid_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&advertisementrequestid_prefix);
    std::__cxx11::to_string((string *)type_string_1,value->advertisementRequestId);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[19],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [19])"XrAsyncRequestIdFB",&advertisementrequestid_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type_string_1);
    std::__cxx11::string::~string((string *)type_string_1);
    std::__cxx11::string::string((string *)&result_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&result_prefix);
    if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
      std::__cxx11::to_string((string *)type_string_1,value->result);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [9])"XrResult",&result_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type_string_1)
      ;
      std::__cxx11::string::~string((string *)type_string_1);
    }
    else {
      type_string_1[0x30] = '\0';
      type_string_1[0x31] = '\0';
      type_string_1[0x32] = '\0';
      type_string_1[0x33] = '\0';
      type_string_1[0x34] = '\0';
      type_string_1[0x35] = '\0';
      type_string_1[0x36] = '\0';
      type_string_1[0x37] = '\0';
      type_string_1[0x38] = '\0';
      type_string_1[0x39] = '\0';
      type_string_1[0x3a] = '\0';
      type_string_1[0x3b] = '\0';
      type_string_1[0x3c] = '\0';
      type_string_1[0x3d] = '\0';
      type_string_1[0x3e] = '\0';
      type_string_1[0x3f] = '\0';
      type_string_1[0x20] = '\0';
      type_string_1[0x21] = '\0';
      type_string_1[0x22] = '\0';
      type_string_1[0x23] = '\0';
      type_string_1[0x24] = '\0';
      type_string_1[0x25] = '\0';
      type_string_1[0x26] = '\0';
      type_string_1[0x27] = '\0';
      type_string_1[0x28] = '\0';
      type_string_1[0x29] = '\0';
      type_string_1[0x2a] = '\0';
      type_string_1[0x2b] = '\0';
      type_string_1[0x2c] = '\0';
      type_string_1[0x2d] = '\0';
      type_string_1[0x2e] = '\0';
      type_string_1[0x2f] = '\0';
      type_string_1[0x10] = '\0';
      type_string_1[0x11] = '\0';
      type_string_1[0x12] = '\0';
      type_string_1[0x13] = '\0';
      type_string_1[0x14] = '\0';
      type_string_1[0x15] = '\0';
      type_string_1[0x16] = '\0';
      type_string_1[0x17] = '\0';
      type_string_1[0x18] = '\0';
      type_string_1[0x19] = '\0';
      type_string_1[0x1a] = '\0';
      type_string_1[0x1b] = '\0';
      type_string_1[0x1c] = '\0';
      type_string_1[0x1d] = '\0';
      type_string_1[0x1e] = '\0';
      type_string_1[0x1f] = '\0';
      type_string_1[0] = '\0';
      type_string_1[1] = '\0';
      type_string_1[2] = '\0';
      type_string_1[3] = '\0';
      type_string_1[4] = '\0';
      type_string_1[5] = '\0';
      type_string_1[6] = '\0';
      type_string_1[7] = '\0';
      type_string_1[8] = '\0';
      type_string_1[9] = '\0';
      type_string_1[10] = '\0';
      type_string_1[0xb] = '\0';
      type_string_1[0xc] = '\0';
      type_string_1[0xd] = '\0';
      type_string_1[0xe] = '\0';
      type_string_1[0xf] = '\0';
      p_Var2 = gen_dispatch_table->ResultToString;
      pXVar4 = FindInstanceFromDispatchTable(gen_dispatch_table);
      (*p_Var2)(pXVar4,value->result,type_string_1);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[9],std::__cxx11::string&,char(&)[64]>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [9])"XrResult",&result_prefix,&type_string_1);
    }
    std::__cxx11::string::~string((string *)&result_prefix);
    std::__cxx11::string::~string((string *)&advertisementrequestid_prefix);
    std::__cxx11::string::~string((string *)&next_prefix);
    std::__cxx11::string::~string((string *)&type_prefix);
    return true;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid Operation");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrEventDataColocationAdvertisementCompleteMETA* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string advertisementrequestid_prefix = prefix;
        advertisementrequestid_prefix += "advertisementRequestId";
        contents.emplace_back("XrAsyncRequestIdFB", advertisementrequestid_prefix, std::to_string(value->advertisementRequestId));
        std::string result_prefix = prefix;
        result_prefix += "result";
        if (nullptr != gen_dispatch_table) {
            char result_string[XR_MAX_RESULT_STRING_SIZE] = {};
            gen_dispatch_table->ResultToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                               value->result, result_string);
            contents.emplace_back("XrResult", result_prefix, result_string);
        } else {
                        contents.emplace_back("XrResult", result_prefix, std::to_string(value->result));
        }
        return true;
    } catch(...) {
    }
    return false;
}